

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint32_t Bernstein(char *key,int len,uint32_t seed)

{
  uint8_t *end;
  uint8_t *data;
  uint32_t seed_local;
  int len_local;
  char *key_local;
  
  seed_local = seed;
  for (data = (uint8_t *)key; data < key + len; data = data + 1) {
    seed_local = seed_local * 0x21 + (uint)*data;
  }
  return seed_local;
}

Assistant:

uint32_t
Bernstein(const char *key, int len, uint32_t seed)
{
  const uint8_t  *data = (const uint8_t *)key;
  const uint8_t *const end = &data[len];
  while (data < end) {
    //seed = ((seed << 5) + seed) + *data++;
    seed = 33 * seed + *data++;
  }
  return seed;
}